

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O0

void lib::string::RegisterLibString(State *state)

{
  State *in_RDI;
  TableMemberReg string [7];
  Library lib;
  char *in_stack_ffffffffffffff38;
  anon_union_8_3_6606d591_for_TableMemberReg_1 in_stack_ffffffffffffff40;
  TableMemberReg TStack_b0;
  TableMemberReg TStack_98;
  TableMemberReg TStack_80;
  TableMemberReg TStack_68;
  TableMemberReg TStack_50;
  TableMemberReg TStack_38;
  Library local_18;
  
  luna::Library::Library(&local_18,in_RDI);
  luna::TableMemberReg::TableMemberReg((TableMemberReg *)&stack0xffffffffffffff38,"byte",Byte);
  luna::TableMemberReg::TableMemberReg(&TStack_b0,"char",Char);
  luna::TableMemberReg::TableMemberReg(&TStack_98,"len",Len);
  luna::TableMemberReg::TableMemberReg(&TStack_80,"lower",Lower);
  luna::TableMemberReg::TableMemberReg(&TStack_68,"reverse",Reverse);
  luna::TableMemberReg::TableMemberReg(&TStack_50,"sub",Sub);
  luna::TableMemberReg::TableMemberReg(&TStack_38,"upper",Upper);
  luna::Library::RegisterTableFunction<7ul>
            ((Library *)in_stack_ffffffffffffff40.func_,in_stack_ffffffffffffff38,
             (TableMemberReg (*) [7])0x167520);
  return;
}

Assistant:

void RegisterLibString(luna::State *state)
    {
        luna::Library lib(state);
        luna::TableMemberReg string[] = {
            { "byte", Byte },
            { "char", Char },
            { "len", Len },
            { "lower", Lower },
            { "reverse", Reverse },
            { "sub", Sub },
            { "upper", Upper }
        };
        lib.RegisterTableFunction("string", string);
    }